

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O3

BOOL SetFileTime(HANDLE hFile,FILETIME *lpCreationTime,FILETIME *lpLastAccessTime,
                FILETIME *lpLastWriteTime)

{
  PAL_ERROR PVar1;
  uint uVar2;
  CPalThread *pThread;
  int *piVar3;
  PAL_ERROR *pPVar4;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032cfca;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  if (((lpCreationTime == (FILETIME *)0x0) || (-1 < (int)lpCreationTime->dwHighDateTime)) &&
     ((lpLastAccessTime == (FILETIME *)0x0 || (-1 < (int)lpLastAccessTime->dwHighDateTime)))) {
    if (lpLastWriteTime == (FILETIME *)0x0) {
      lpLastWriteTime = (FILETIME *)0x0;
    }
    else if ((int)lpLastWriteTime->dwHighDateTime < 0) goto LAB_0032cf7d;
    PVar1 = CorUnix::InternalSetFileTime
                      (pThread,hFile,lpCreationTime,lpLastAccessTime,lpLastWriteTime);
    if (PVar1 != 0) {
      pPVar4 = (PAL_ERROR *)__errno_location();
      *pPVar4 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0032cfca:
      abort();
    }
    uVar2 = (uint)(PVar1 == 0);
  }
  else {
LAB_0032cf7d:
    piVar3 = __errno_location();
    *piVar3 = 6;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

BOOL
PALAPI
SetFileTime(
        IN HANDLE hFile,
        IN CONST FILETIME *lpCreationTime,
        IN CONST FILETIME *lpLastAccessTime,
        IN CONST FILETIME *lpLastWriteTime)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    const UINT64 MAX_FILETIMEVALUE = 0x8000000000000000LL;

    PERF_ENTRY(SetFileTime);
    ENTRY("SetFileTime(hFile=%p, lpCreationTime=%p, lpLastAccessTime=%p, "
          "lpLastWriteTime=%p)\n", hFile, lpCreationTime, lpLastAccessTime, 
          lpLastWriteTime);

    pThread = InternalGetCurrentThread();

    /* validate filetime values */
    if ( (lpCreationTime && (((UINT64)lpCreationTime->dwHighDateTime   << 32) + 
          lpCreationTime->dwLowDateTime   >= MAX_FILETIMEVALUE)) ||        
         (lpLastAccessTime && (((UINT64)lpLastAccessTime->dwHighDateTime << 32) + 
          lpLastAccessTime->dwLowDateTime >= MAX_FILETIMEVALUE)) ||
         (lpLastWriteTime && (((UINT64)lpLastWriteTime->dwHighDateTime  << 32) + 
          lpLastWriteTime->dwLowDateTime  >= MAX_FILETIMEVALUE)))
    {
        pThread->SetLastError(ERROR_INVALID_HANDLE);
        return FALSE;
    }

    palError = InternalSetFileTime(
        pThread,
        hFile,
        lpCreationTime,
        lpLastAccessTime,
        lpLastWriteTime
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("SetFileTime returns BOOL %s\n", NO_ERROR == palError ? "TRUE":"FALSE");
    PERF_EXIT(SetFileTime);
    return NO_ERROR == palError;
}